

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo
          (cmLocalUnixMakefileGenerator3 *this,ostream *cmakefileStream,cmGeneratorTarget *target)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *target_00;
  string *__k;
  mapped_type *pmVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  char *pcVar7;
  size_t sVar8;
  _Base_ptr p_Var9;
  char *pcVar10;
  _Rb_tree_header *p_Var11;
  pointer source;
  _Alloc_hider str;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transformRules;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  allocator local_121;
  undefined1 local_120 [32];
  _Rb_tree_node_base *local_100;
  size_t local_f8;
  cmLocalUnixMakefileGenerator3 *local_f0;
  _Rb_tree_node_base *local_e8;
  ostream *local_e0;
  string local_d8;
  string local_b0;
  string local_90;
  cmGeneratorTarget *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  _Base_ptr local_50;
  string *local_48;
  cmOutputConverter *local_40;
  _Rb_tree_node_base *local_38;
  
  local_f0 = this;
  local_70 = target;
  __k = cmGeneratorTarget::GetName_abi_cxx11_(target);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap>_>_>
           ::operator[](&(this->ImplicitDepends).
                         super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependLanguageMap>_>_>
                        ,__k);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"# The set of languages for which implicit dependencies are needed:\n",
             0x43);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"set(CMAKE_DEPENDS_LANGUAGES\n",0x1c);
  p_Var11 = &(pmVar2->
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap>_>_>
             )._M_t._M_impl.super__Rb_tree_header;
  for (p_Var4 = (pmVar2->
                super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap>_>_>
                )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var11;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  \"",3);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (cmakefileStream,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  )\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (cmakefileStream,"# The set of files for implicit dependencies of each language:\n",0x3f
            );
  p_Var9 = (pmVar2->
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::ImplicitDependFileMap>_>_>
           )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_e0 = cmakefileStream;
  if ((_Rb_tree_header *)p_Var9 != p_Var11) {
    local_48 = &(local_f0->super_cmLocalCommonGenerator).ConfigName;
    local_40 = &(local_f0->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter;
    local_50 = &p_Var11->_M_header;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                (cmakefileStream,"set(CMAKE_DEPENDS_CHECK_",0x18);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (cmakefileStream,*(char **)(p_Var9 + 1),(long)p_Var9[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      p_Var6 = p_Var9[2]._M_right;
      local_38 = (_Rb_tree_node_base *)&p_Var9[2]._M_parent;
      local_e8 = p_Var9;
      if (p_Var6 != local_38) {
        do {
          poVar3 = local_e0;
          p_Var9 = *(_Base_ptr *)(p_Var6 + 2);
          if (p_Var9 != p_Var6[2]._M_parent) {
            do {
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  \"",3);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar3,*(char **)p_Var9,(long)p_Var9->_M_parent);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" ",2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar3,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
              p_Var9 = p_Var9 + 1;
            } while (p_Var9 != p_Var6[2]._M_parent);
          }
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        } while (p_Var6 != local_38);
      }
      cmakefileStream = local_e0;
      std::__ostream_insert<char,std::char_traits<char>>(local_e0,"  )\n",4);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"CMAKE_","");
      std::__cxx11::string::_M_append((char *)&local_d8,*(ulong *)(local_e8 + 1));
      target_00 = local_70;
      std::__cxx11::string::append((char *)&local_d8);
      pcVar7 = cmMakefile::GetDefinition
                         ((local_f0->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,
                          &local_d8);
      if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
        std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"set(CMAKE_",10);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (cmakefileStream,*(char **)(local_e8 + 1),(long)local_e8[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_COMPILER_ID \"",0xe);
        sVar8 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar7,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\")\n",3);
      }
      p_Var4 = local_e8;
      p_Var9 = local_e8 + 1;
      local_120._8_4_ = _S_red;
      local_120._16_8_ = (_Base_ptr)0x0;
      local_120._24_8_ = local_120 + 8;
      local_f8 = 0;
      local_100 = (_Rb_tree_node_base *)local_120._24_8_;
      cmLocalGenerator::AddCompileDefinitions
                ((cmLocalGenerator *)local_f0,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_120,target_00,local_48,(string *)p_Var9);
      if (local_f8 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (cmakefileStream,"# Preprocessor definitions for this target.\n",0x2c);
        std::__ostream_insert<char,std::char_traits<char>>
                  (cmakefileStream,"set(CMAKE_TARGET_DEFINITIONS_",0x1d);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (cmakefileStream,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        for (p_Var4 = (_Rb_tree_node_base *)local_120._24_8_;
            p_Var4 != (_Rb_tree_node_base *)(local_120 + 8);
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  ",2);
          cmOutputConverter::EscapeForCMake(&local_90,(string *)(p_Var4 + 1));
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (cmakefileStream,local_90._M_dataplus._M_p,local_90._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  )\n",4);
        p_Var4 = local_e8;
      }
      std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (cmakefileStream,"# The include file search paths:\n",0x21);
      std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"set(CMAKE_",10);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (cmakefileStream,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_TARGET_INCLUDE_PATH\n",0x15);
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar1 = (local_f0->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CMAKE_BUILD_TYPE","");
      pcVar7 = cmMakefile::GetSafeDefinition(pcVar1,&local_b0);
      std::__cxx11::string::string((string *)&local_90,pcVar7,&local_121);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      cmLocalGenerator::GetIncludeDirectories
                ((cmLocalGenerator *)local_f0,&local_68,local_70,(string *)p_Var9,&local_90,true);
      for (source = local_68.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          source != local_68.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; source = source + 1) {
        std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  \"",3);
        cmOutputConverter::Convert(&local_b0,local_40,source,HOME_OUTPUT,UNCHANGED);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (cmakefileStream,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(cmakefileStream,"  )\n",4);
      p_Var6 = local_50;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(local_e8);
    } while (p_Var9 != p_Var6);
  }
  local_d8._M_dataplus._M_p = (pointer)0x0;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  pcVar1 = (local_f0->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  pcVar7 = local_120 + 0x10;
  local_120._0_8_ = pcVar7;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_120,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM","");
  pcVar10 = cmMakefile::GetProperty(pcVar1,(string *)local_120);
  if ((char *)local_120._0_8_ != pcVar7) {
    operator_delete((void *)local_120._0_8_,(ulong)(local_120._16_8_ + 1));
  }
  if (pcVar10 != (char *)0x0) {
    local_120._0_8_ = pcVar7;
    sVar8 = strlen(pcVar10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,pcVar10,pcVar10 + sVar8);
    cmSystemTools::ExpandListArgument
              ((string *)local_120,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_d8,false);
    if ((char *)local_120._0_8_ != pcVar7) {
      operator_delete((void *)local_120._0_8_,(ulong)(local_120._16_8_ + 1));
    }
  }
  local_120._0_8_ = pcVar7;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_120,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM","");
  pcVar10 = cmGeneratorTarget::GetProperty(local_70,(string *)local_120);
  if ((char *)local_120._0_8_ != pcVar7) {
    operator_delete((void *)local_120._0_8_,(ulong)(local_120._16_8_ + 1));
  }
  if (pcVar10 != (char *)0x0) {
    local_120._0_8_ = pcVar7;
    sVar8 = strlen(pcVar10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,pcVar10,pcVar10 + sVar8);
    cmSystemTools::ExpandListArgument
              ((string *)local_120,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_d8,false);
    if ((char *)local_120._0_8_ != pcVar7) {
      operator_delete((void *)local_120._0_8_,(ulong)(local_120._16_8_ + 1));
    }
  }
  if (local_d8._M_dataplus._M_p != (pointer)local_d8._M_string_length) {
    std::__ostream_insert<char,std::char_traits<char>>
              (cmakefileStream,"set(CMAKE_INCLUDE_TRANSFORMS\n",0x1d);
    if (local_d8._M_dataplus._M_p != (pointer)local_d8._M_string_length) {
      str._M_p = local_d8._M_dataplus._M_p;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(local_e0,"  ",2);
        cmOutputConverter::EscapeForCMake((string *)local_120,(string *)str._M_p);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_e0,(char *)local_120._0_8_,
                            CONCAT44(local_120._12_4_,local_120._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if ((char *)local_120._0_8_ != pcVar7) {
          operator_delete((void *)local_120._0_8_,(ulong)(local_120._16_8_ + 1));
        }
        str._M_p = str._M_p + 0x20;
      } while (str._M_p != (pointer)local_d8._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_e0,"  )\n",4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_d8);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3
::WriteDependLanguageInfo(std::ostream& cmakefileStream,
                          cmGeneratorTarget* target)
{
  ImplicitDependLanguageMap const& implicitLangs =
    this->GetImplicitDepends(target);

  // list the languages
  cmakefileStream
    << "# The set of languages for which implicit dependencies are needed:\n";
  cmakefileStream
    << "set(CMAKE_DEPENDS_LANGUAGES\n";
  for(ImplicitDependLanguageMap::const_iterator
        l = implicitLangs.begin(); l != implicitLangs.end(); ++l)
    {
    cmakefileStream << "  \"" << l->first << "\"\n";
    }
  cmakefileStream << "  )\n";

  // now list the files for each language
  cmakefileStream
    << "# The set of files for implicit dependencies of each language:\n";
  for(ImplicitDependLanguageMap::const_iterator
        l = implicitLangs.begin(); l != implicitLangs.end(); ++l)
    {
    cmakefileStream
      << "set(CMAKE_DEPENDS_CHECK_" << l->first << "\n";
    ImplicitDependFileMap const& implicitPairs = l->second;

    // for each file pair
    for(ImplicitDependFileMap::const_iterator pi = implicitPairs.begin();
        pi != implicitPairs.end(); ++pi)
      {
      for(cmDepends::DependencyVector::const_iterator di = pi->second.begin();
          di != pi->second.end(); ++ di)
        {
        cmakefileStream << "  \"" << *di << "\" ";
        cmakefileStream << "\"" << pi->first << "\"\n";
        }
      }
    cmakefileStream << "  )\n";

    // Tell the dependency scanner what compiler is used.
    std::string cidVar = "CMAKE_";
    cidVar += l->first;
    cidVar += "_COMPILER_ID";
    const char* cid = this->Makefile->GetDefinition(cidVar);
    if(cid && *cid)
      {
      cmakefileStream
        << "set(CMAKE_" << l->first << "_COMPILER_ID \""
        << cid << "\")\n";
      }

    // Build a list of preprocessor definitions for the target.
    std::set<std::string> defines;
    this->AddCompileDefinitions(defines, target,
                                this->ConfigName, l->first);
    if(!defines.empty())
      {
      cmakefileStream
        << "\n"
        << "# Preprocessor definitions for this target.\n"
        << "set(CMAKE_TARGET_DEFINITIONS_" << l->first << "\n";
      for(std::set<std::string>::const_iterator di = defines.begin();
          di != defines.end(); ++di)
        {
        cmakefileStream
          << "  " << cmOutputConverter::EscapeForCMake(*di) << "\n";
        }
      cmakefileStream
        << "  )\n";
      }

    // Target-specific include directories:
    cmakefileStream
      << "\n"
      << "# The include file search paths:\n";
    cmakefileStream
      << "set(CMAKE_" << l->first << "_TARGET_INCLUDE_PATH\n";
    std::vector<std::string> includes;


    const std::string& config =
      this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
    this->GetIncludeDirectories(includes, target,
                                l->first, config);
    for(std::vector<std::string>::iterator i = includes.begin();
        i != includes.end(); ++i)
      {
      cmakefileStream
        << "  \""
        << this->Convert(*i, cmLocalGenerator::HOME_OUTPUT)
        << "\"\n";
      }
    cmakefileStream
      << "  )\n";
    }

  // Store include transform rule properties.  Write the directory
  // rules first because they may be overridden by later target rules.
  std::vector<std::string> transformRules;
  if(const char* xform =
     this->Makefile->GetProperty("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM"))
    {
    cmSystemTools::ExpandListArgument(xform, transformRules);
    }
  if(const char* xform =
     target->GetProperty("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM"))
    {
    cmSystemTools::ExpandListArgument(xform, transformRules);
    }
  if(!transformRules.empty())
    {
    cmakefileStream
      << "set(CMAKE_INCLUDE_TRANSFORMS\n";
    for(std::vector<std::string>::const_iterator tri = transformRules.begin();
        tri != transformRules.end(); ++tri)
      {
      cmakefileStream << "  "
          << cmOutputConverter::EscapeForCMake(*tri) << "\n";
      }
    cmakefileStream
      << "  )\n";
    }
}